

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

tmbstr prvTidytidyNormalizedLocaleName(ctmbstr locale)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  tmbstr ptVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  uint uVar7;
  ulong uVar8;
  
  ptVar4 = prvTidytmbstrdup(&prvTidyg_default_allocator,locale);
  ptVar4 = prvTidytmbstrtolower(ptVar4);
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (localeMappings[uVar7].winName == (char *)0x0) goto LAB_00138fca;
    iVar3 = strcmp(localeMappings[uVar7].winName,ptVar4);
    uVar2 = uVar7 + 1;
  } while (iVar3 != 0);
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar4);
  ptVar4 = prvTidytmbstrdup(&prvTidyg_default_allocator,localeMappings[uVar7].POSIXName);
LAB_00138fca:
  sVar5 = strlen(ptVar4);
  uVar1 = 5;
  if ((uint)sVar5 < 5) {
    uVar1 = sVar5;
  }
  uVar8 = 0;
  do {
    if ((uVar1 & 0xffffffff) == uVar8) {
LAB_00139026:
      (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar4);
      return prvTidytidyNormalizedLocaleName::result;
    }
    if (uVar8 == 2) {
      if ((uint)sVar5 < 5) {
        prvTidytidyNormalizedLocaleName::result[2] = '\0';
        goto LAB_00139026;
      }
      prvTidytidyNormalizedLocaleName::result[2] = '_';
    }
    else {
      pp_Var6 = __ctype_tolower_loc();
      prvTidytidyNormalizedLocaleName::result[uVar8] = (char)(*pp_Var6)[ptVar4[uVar8]];
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

tmbstr TY_(tidyNormalizedLocaleName)( ctmbstr locale )
{
    uint i;
    uint len;
    static char result[6] = "xx_yy";
    TidyAllocator * allocator = &TY_(g_default_allocator);

    tmbstr search = TY_(tmbstrdup)( allocator, locale );
    search = TY_(tmbstrtolower)(search);
    
    /* See if our string matches a Windows name. */
    for (i = 0; localeMappings[i].winName; ++i)
    {
        if ( strcmp( localeMappings[i].winName, search ) == 0 )
        {
            TidyFree( allocator, search );
            search = TY_(tmbstrdup)( allocator, localeMappings[i].POSIXName );
            break;
        }
    }
    
    /* We're going to be stupid about this and trust the user, and
     return just the first two characters if they exist and the
     4th and 5th if they exist. The worst that can happen is a
     junk language that doesn't exist and won't be set. */
    
    len = strlen( search );
    len = ( len <= 5 ? len : 5 );
    
    for ( i = 0; i < len; i++ )
    {
        if ( i == 2 )
        {
            /* Either terminate the string or ensure there's an underscore */
            if (len == 5) {
                result[i] = '_';
            }
            else {
                result[i] = '\0';
                break;      /* no need to copy after null */
            }
        }
        else
        {
            result[i] = tolower( search[i] );
        }
    }
    
    TidyFree( allocator, search );
    return result;
}